

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_multiobj.h
# Opt level: O0

void __thiscall
mp::
MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConsiderEmulatingMultiobj
          (MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this)

{
  bool bVar1;
  int iVar2;
  Env *pEVar3;
  undefined4 *in_RDI;
  MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_00000600;
  
  *in_RDI = 1;
  iVar2 = FlatModel<mp::DefaultFlatModelParams>::num_objs
                    ((FlatModel<mp::DefaultFlatModelParams> *)0x663925);
  if (1 < iVar2) {
    pEVar3 = EnvKeeper::GetEnv((EnvKeeper *)(in_RDI + 0x32));
    bVar1 = BasicSolver::multiobj_has_native(pEVar3);
    if (bVar1) {
      pEVar3 = EnvKeeper::GetEnv((EnvKeeper *)(in_RDI + 0x32));
      iVar2 = BasicSolver::multiobj(pEVar3);
      if (iVar2 < 2) {
        return;
      }
    }
    SetupMultiobjEmulation(in_stack_00000600);
  }
  return;
}

Assistant:

void ConsiderEmulatingMultiobj() {
    status_ = MOManagerStatus::NOT_ACTIVE;
    if (MPCD(num_objs())>1                                  // have multiple objectives
        && (MPCD(GetEnv()).multiobj_has_native()==false
            || MPCD(GetEnv()).multiobj()>1))                // force emulation
      SetupMultiobjEmulation();
    // Anything todo otherwise?
  }